

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

void cf_sha384_init(cf_sha512_context *ctx)

{
  memset(ctx->partial,0,0x90);
  ctx->H[0] = 0xcbbb9d5dc1059ed8;
  ctx->H[1] = 0x629a292a367cd507;
  ctx->H[2] = 0x9159015a3070dd17;
  ctx->H[3] = 0x152fecd8f70e5939;
  ctx->H[4] = 0x67332667ffc00b31;
  ctx->H[5] = 0x8eb44a8768581511;
  ctx->H[6] = 0xdb0c2e0d64f98fa7;
  ctx->H[7] = 0x47b5481dbefa4fa4;
  return;
}

Assistant:

void cf_sha384_init(cf_sha512_context *ctx)
{
  memset(ctx, 0, sizeof *ctx);
  ctx->H[0] = UINT64_C(0xcbbb9d5dc1059ed8);
  ctx->H[1] = UINT64_C(0x629a292a367cd507);
  ctx->H[2] = UINT64_C(0x9159015a3070dd17);
  ctx->H[3] = UINT64_C(0x152fecd8f70e5939);
  ctx->H[4] = UINT64_C(0x67332667ffc00b31);
  ctx->H[5] = UINT64_C(0x8eb44a8768581511);
  ctx->H[6] = UINT64_C(0xdb0c2e0d64f98fa7);
  ctx->H[7] = UINT64_C(0x47b5481dbefa4fa4);
}